

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O0

int hw_breakpoint_insert(CPUX86State *env,int index)

{
  unsigned_long dr7_00;
  vaddr addr;
  _Bool _Var1;
  int iVar2;
  CPUState *cpu;
  int local_3c;
  int err;
  target_ulong drN;
  target_ulong dr7;
  CPUState *cs;
  int index_local;
  CPUX86State *env_local;
  
  cpu = env_cpu(env);
  dr7_00 = env->dr[7];
  addr = env->dr[index];
  local_3c = 0;
  iVar2 = hw_breakpoint_type(dr7_00,index);
  switch(iVar2) {
  case 0:
    _Var1 = hw_breakpoint_enabled(dr7_00,index);
    if (_Var1) {
      local_3c = cpu_breakpoint_insert_x86_64
                           (cpu,addr,0x20,(CPUBreakpoint **)(env->dr + (long)index + 8));
    }
    break;
  case 1:
    _Var1 = hw_breakpoint_enabled(dr7_00,index);
    if (_Var1) {
      iVar2 = hw_breakpoint_len(dr7_00,index);
      local_3c = cpu_watchpoint_insert_x86_64
                           (cpu,addr,(long)iVar2,0x22,(CPUWatchpoint **)(env->dr + (long)index + 8))
      ;
    }
    break;
  case 2:
    _Var1 = hw_breakpoint_enabled(env->dr[7],index);
    if (!_Var1) {
      return 0;
    }
    return 0x1000000;
  case 3:
    _Var1 = hw_breakpoint_enabled(dr7_00,index);
    if (_Var1) {
      iVar2 = hw_breakpoint_len(dr7_00,index);
      local_3c = cpu_watchpoint_insert_x86_64
                           (cpu,addr,(long)iVar2,0x23,(CPUWatchpoint **)(env->dr + (long)index + 8))
      ;
    }
  }
  if (local_3c != 0) {
    env->dr[(long)index + 8] = 0;
  }
  return 0;
}

Assistant:

static int hw_breakpoint_insert(CPUX86State *env, int index)
{
    CPUState *cs = env_cpu(env);
    target_ulong dr7 = env->dr[7];
    target_ulong drN = env->dr[index];
    int err = 0;

    switch (hw_breakpoint_type(dr7, index)) {
    case DR7_TYPE_BP_INST:
        if (hw_breakpoint_enabled(dr7, index)) {
            err = cpu_breakpoint_insert(cs, drN, BP_CPU,
                                        &env->cpu_breakpoint[index]);
        }
        break;

    case DR7_TYPE_IO_RW:
        /* Notice when we should enable calls to bpt_io.  */
        return hw_breakpoint_enabled(env->dr[7], index)
               ? HF_IOBPT_MASK : 0;

    case DR7_TYPE_DATA_WR:
        if (hw_breakpoint_enabled(dr7, index)) {
            err = cpu_watchpoint_insert(cs, drN,
                                        hw_breakpoint_len(dr7, index),
                                        BP_CPU | BP_MEM_WRITE,
                                        &env->cpu_watchpoint[index]);
        }
        break;

    case DR7_TYPE_DATA_RW:
        if (hw_breakpoint_enabled(dr7, index)) {
            err = cpu_watchpoint_insert(cs, drN,
                                        hw_breakpoint_len(dr7, index),
                                        BP_CPU | BP_MEM_ACCESS,
                                        &env->cpu_watchpoint[index]);
        }
        break;
    }
    if (err) {
        env->cpu_breakpoint[index] = NULL;
    }
    return 0;
}